

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

bool __thiscall mjs::gc_heap::type_check<mjs::function_object>(gc_heap *this,uint32_t pos)

{
  slot *psVar1;
  gc_type_info *pgVar2;
  long lVar3;
  
  psVar1 = allocation_context::get_at(&this->alloc_context_,pos - 1);
  pgVar2 = gc_type_info::from_index((psVar1->allocation).type);
  if ((pgVar2->convertible_to_object_ == true) &&
     (psVar1 = allocation_context::get_at(&this->alloc_context_,pos), psVar1 != (slot *)0x0)) {
    lVar3 = __dynamic_cast(psVar1,&object::typeinfo,&function_object::typeinfo,0);
    return lVar3 != 0;
  }
  return false;
}

Assistant:

bool type_check(uint32_t pos) const {
        const auto a = get_at(pos-1)->allocation;
        if constexpr (std::is_convertible_v<T*, object*>) {
            // Avoid creating gc_type_info_registration<T>'s for interface types
            return a.type_info().is_convertible_to_object() && dynamic_cast<T*>(reinterpret_cast<object*>(get_at(pos)));
        } else {
            return gc_type_info_registration<T>::index()  == a.type;
        }
    }